

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::checkAndLogCallValues
          (AtomicCounterTest *this,TestLog *log,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *increments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *decrements,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *preGets,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *postGets,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *gets)

{
  pointer *this_00;
  int iVar1;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  char *pcVar5;
  size_type sVar6;
  const_reference pvVar7;
  MessageBuilder *pMVar8;
  MessageBuilder local_1bb0;
  MessageBuilder local_1a30;
  allocator<char> local_18a9;
  string local_18a8;
  string local_1888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1808;
  string local_17e8;
  allocator<char> local_17c1;
  string local_17c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1780;
  string local_1760;
  ScopedLogSection local_1740;
  ScopedLogSection uniquenesCheck_3;
  MessageBuilder local_15b8;
  allocator<char> local_1431;
  string local_1430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f0;
  string local_13d0;
  allocator<char> local_13a9;
  string local_13a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1368;
  string local_1348;
  ScopedLogSection local_1328;
  ScopedLogSection uniquenesCheck_2;
  MessageBuilder local_11a0;
  allocator<char> local_1019;
  string local_1018;
  string local_ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f78;
  string local_f58;
  allocator<char> local_f31;
  string local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  string local_ed0;
  ScopedLogSection local_eb0;
  ScopedLogSection uniquenesCheck_1;
  MessageBuilder local_d28;
  allocator<char> local_ba1;
  string local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  string local_b40;
  allocator<char> local_b19;
  string local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  string local_ab8;
  ScopedLogSection local_a98;
  ScopedLogSection uniquenesCheck;
  MessageBuilder local_910;
  allocator<char> local_789;
  string local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  string local_728;
  allocator<char> local_701;
  string local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  string local_6a0;
  ScopedLogSection local_680;
  ScopedLogSection valueCheck_1;
  deUint32 local_4f4;
  MessageBuilder local_4f0;
  deUint32 local_36c;
  MessageBuilder local_368;
  int local_1e4;
  int local_1e0;
  int valueNdx;
  int changedValues;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  allocator<char> local_151;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  ScopedLogSection local_d0;
  ScopedLogSection valueCheck;
  undefined1 local_b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterPostGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterPreGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterDecrements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterIncrements;
  int counterNdx;
  bool isOk;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *postGets_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *preGets_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *decrements_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *increments_local;
  TestLog *log_local;
  AtomicCounterTest *this_local;
  
  counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  for (counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage < (this->m_spec).atomicCounterCount;
      counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    this_00 = &counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &counterPreGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &counterPostGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &counterGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
    getCountersValues((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,increments,
                      (int)counterIncrements.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                      (this->m_spec).atomicCounterCount);
    getCountersValues((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &counterPreGets.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,decrements,
                      (int)counterIncrements.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                      (this->m_spec).atomicCounterCount);
    getCountersValues((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &counterPostGets.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,preGets,
                      (int)counterIncrements.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                      (this->m_spec).atomicCounterCount);
    getCountersValues((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &counterGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,postGets,
                      (int)counterIncrements.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                      (this->m_spec).atomicCounterCount);
    getCountersValues((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,gets,
                      (int)counterIncrements.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                      (this->m_spec).atomicCounterCount);
    if ((this->m_spec).operations == OPERATION_GET) {
      de::toString<int>(&local_150,
                        (int *)&counterIncrements.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_130,"counter",&local_150);
      std::operator+(&local_110,&local_130," value check");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar5,&local_151);
      de::toString<int>((string *)&changedValues,
                        (int *)&counterIncrements.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_1b8,"Check that counter",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &changedValues);
      std::operator+(&local_198,&local_1b8," values haven\'t changed.");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,pcVar5,(allocator<char> *)((long)&valueNdx + 3));
      tcu::ScopedLogSection::ScopedLogSection(&local_d0,log,&local_f0,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)((long)&valueNdx + 3));
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&changedValues);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_151);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      local_1e0 = 0;
      for (local_1e4 = 0; iVar1 = local_1e4,
          sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(gets),
          iVar1 < (int)sVar6; local_1e4 = local_1e4 + 1) {
        if ((((this->m_spec).useBranches & 1U) == 0) ||
           (pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (gets,(long)local_1e4), *pvVar7 != 0xffffffff)) {
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (gets,(long)local_1e4);
          dVar4 = *pvVar7;
          dVar3 = getInitialValue(this);
          if (dVar4 != dVar3) {
            if (local_1e0 < 0x14) {
              tcu::TestLog::operator<<(&local_368,log,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<(&local_368,(char (*) [22])0x2befc93);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(int *)&counterIncrements.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
              ;
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])0x2c59534);
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (gets,(long)local_1e4);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,pvVar7);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [11])0x2b870eb);
              local_36c = getInitialValue(this);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_36c);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_368);
            }
            counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            local_1e0 = local_1e0 + 1;
          }
        }
      }
      if (local_1e0 == 0) {
        tcu::TestLog::operator<<(&local_4f0,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_4f0,(char (*) [45])"All values returned by atomicCounter(counter"
                           );
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(int *)&counterIncrements.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [23])") match initial value ");
        local_4f4 = getInitialValue(this);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_4f4);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b5e49a);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4f0);
      }
      else if (0x14 < local_1e0) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&valueCheck_1,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&valueCheck_1,
                            (char (*) [65])
                            "Total number of invalid values returned by atomicCounter(counter");
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(int *)&counterIncrements.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2b47c71);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1e0);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [29])0x2bf01a5);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&valueCheck_1);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
    }
    else if (((this->m_spec).operations & (OPERATION_DEC|OPERATION_INC)) ==
             (OPERATION_DEC|OPERATION_INC)) {
      de::toString<int>(&local_700,
                        (int *)&counterIncrements.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_6e0,"counter",&local_700);
      std::operator+(&local_6c0,&local_6e0," path check");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,pcVar5,&local_701);
      de::toString<int>(&local_788,
                        (int *)&counterIncrements.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_768,"Check that there is order in which counter",&local_788);
      std::operator+(&local_748,&local_768," increments and decrements could have happened.");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,pcVar5,&local_789);
      tcu::ScopedLogSection::ScopedLogSection(&local_680,log,&local_6a0,&local_728);
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator(&local_789);
      std::__cxx11::string::~string((string *)&local_748);
      std::__cxx11::string::~string((string *)&local_768);
      std::__cxx11::string::~string((string *)&local_788);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_701);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_700);
      dVar4 = getInitialValue(this);
      bVar2 = checkPath((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &counterDecrements.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &counterPreGets.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,dVar4,&this->m_spec);
      if (bVar2) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&uniquenesCheck,log,(BeginMessageToken *)&tcu::TestLog::Message
                  );
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&uniquenesCheck,
                            (char (*) [64])
                            "Found possible order of calls to atomicCounterIncrement(counter");
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(int *)&counterIncrements.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [37])") and atomicCounterDecrement(counter");
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(int *)&counterIncrements.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2c156ab);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&uniquenesCheck);
      }
      else {
        counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        tcu::TestLog::operator<<(&local_910,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_910,
                            (char (*) [61])
                            "No possible order of calls to atomicCounterIncrement(counter");
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(int *)&counterIncrements.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [37])") and atomicCounterDecrement(counter");
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(int *)&counterIncrements.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])0x2c79168);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_910);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_680);
    }
    else if (((this->m_spec).operations & OPERATION_INC) == 0) {
      if (((this->m_spec).operations & OPERATION_DEC) != 0) {
        de::toString<int>(&local_13a8,
                          (int *)&counterIncrements.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_1388,"counter",&local_13a8);
        std::operator+(&local_1368,&local_1388," check uniqueness and linearity");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1348,pcVar5,&local_13a9)
        ;
        de::toString<int>(&local_1430,
                          (int *)&counterIncrements.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_1410,"Check that counter",&local_1430);
        std::operator+(&local_13f0,&local_1410," returned only unique and linear values.");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_13d0,pcVar5,&local_1431)
        ;
        tcu::ScopedLogSection::ScopedLogSection(&local_1328,log,&local_1348,&local_13d0);
        std::__cxx11::string::~string((string *)&local_13d0);
        std::allocator<char>::~allocator(&local_1431);
        std::__cxx11::string::~string((string *)&local_13f0);
        std::__cxx11::string::~string((string *)&local_1410);
        std::__cxx11::string::~string((string *)&local_1430);
        std::__cxx11::string::~string((string *)&local_1348);
        std::allocator<char>::~allocator(&local_13a9);
        std::__cxx11::string::~string((string *)&local_1368);
        std::__cxx11::string::~string((string *)&local_1388);
        std::__cxx11::string::~string((string *)&local_13a8);
        bVar2 = checkUniquenessAndLinearity
                          (log,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &counterPreGets.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&uniquenesCheck_3,log,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&uniquenesCheck_3,(char (*) [31])0x2befd51);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(int *)&counterIncrements.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(char (*) [31])") returned only unique values.");
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&uniquenesCheck_3);
        }
        else {
          counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          tcu::TestLog::operator<<(&local_15b8,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<(&local_15b8,(char (*) [31])0x2befd51);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(int *)&counterIncrements.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(char (*) [30])") returned non unique values.");
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_15b8);
        }
        tcu::ScopedLogSection::~ScopedLogSection(&local_1328);
        if (((counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
           (((this->m_spec).operations & OPERATION_GET) != 0)) {
          de::toString<int>(&local_17c0,
                            (int *)&counterIncrements.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::operator+(&local_17a0,"counter",&local_17c0);
          std::operator+(&local_1780,&local_17a0," check range");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1760,pcVar5,&local_17c1);
          de::toString<int>(&local_1888,
                            (int *)&counterIncrements.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::operator+(&local_1868,"Check that counter",&local_1888);
          std::operator+(&local_1848,&local_1868,
                         " returned only values values between previous and next atomicCounter(counter"
                        );
          de::toString<int>(&local_18a8,
                            (int *)&counterIncrements.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::operator+(&local_1828,&local_1848,&local_18a8);
          std::operator+(&local_1808,&local_1828,".");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_17e8,pcVar5,&local_18a9);
          tcu::ScopedLogSection::ScopedLogSection(&local_1740,log,&local_1760,&local_17e8);
          std::__cxx11::string::~string((string *)&local_17e8);
          std::allocator<char>::~allocator(&local_18a9);
          std::__cxx11::string::~string((string *)&local_1808);
          std::__cxx11::string::~string((string *)&local_1828);
          std::__cxx11::string::~string((string *)&local_18a8);
          std::__cxx11::string::~string((string *)&local_1848);
          std::__cxx11::string::~string((string *)&local_1868);
          std::__cxx11::string::~string((string *)&local_1888);
          std::__cxx11::string::~string((string *)&local_1760);
          std::allocator<char>::~allocator(&local_17c1);
          std::__cxx11::string::~string((string *)&local_1780);
          std::__cxx11::string::~string((string *)&local_17a0);
          std::__cxx11::string::~string((string *)&local_17c0);
          bVar2 = checkRange(log,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &counterPreGets.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &counterGets.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &counterPostGets.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            tcu::TestLog::operator<<(&local_1bb0,log,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<(&local_1bb0,(char (*) [31])0x2befd51);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(int *)&counterIncrements.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [79])
                                       ") returned only values between previous and next call to atomicCounter(counter"
                               );
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(int *)&counterIncrements.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2c156ab);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1bb0);
          }
          else {
            counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            tcu::TestLog::operator<<(&local_1a30,log,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<(&local_1a30,(char (*) [31])0x2befd51);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(int *)&counterIncrements.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [85])
                                       ") returned value that is not between previous and next call to atomicCounter(counter"
                               );
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(int *)&counterIncrements.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2c156ab);
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1a30);
          }
          tcu::ScopedLogSection::~ScopedLogSection(&local_1740);
        }
      }
    }
    else {
      de::toString<int>(&local_b18,
                        (int *)&counterIncrements.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_af8,"counter",&local_b18);
      std::operator+(&local_ad8,&local_af8," check uniqueness and linearity");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab8,pcVar5,&local_b19);
      de::toString<int>(&local_ba0,
                        (int *)&counterIncrements.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_b80,"Check that counter",&local_ba0);
      std::operator+(&local_b60,&local_b80," returned only unique and linear values.");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b40,pcVar5,&local_ba1);
      tcu::ScopedLogSection::ScopedLogSection(&local_a98,log,&local_ab8,&local_b40);
      std::__cxx11::string::~string((string *)&local_b40);
      std::allocator<char>::~allocator(&local_ba1);
      std::__cxx11::string::~string((string *)&local_b60);
      std::__cxx11::string::~string((string *)&local_b80);
      std::__cxx11::string::~string((string *)&local_ba0);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::allocator<char>::~allocator(&local_b19);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::__cxx11::string::~string((string *)&local_af8);
      std::__cxx11::string::~string((string *)&local_b18);
      bVar2 = checkUniquenessAndLinearity
                        (log,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &counterDecrements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&uniquenesCheck_1,log,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&uniquenesCheck_1,(char (*) [31])0x2af4e5d);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(int *)&counterIncrements.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [31])") returned only unique values.");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&uniquenesCheck_1);
      }
      else {
        counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        tcu::TestLog::operator<<(&local_d28,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_d28,(char (*) [31])0x2af4e5d);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(int *)&counterIncrements.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (pMVar8,(char (*) [30])") returned non unique values.");
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_d28);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_a98);
      if (((counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
         (((this->m_spec).operations & OPERATION_GET) != 0)) {
        de::toString<int>(&local_f30,
                          (int *)&counterIncrements.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_f10,"counter",&local_f30);
        std::operator+(&local_ef0,&local_f10," check range");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ed0,pcVar5,&local_f31);
        de::toString<int>(&local_ff8,
                          (int *)&counterIncrements.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_fd8,"Check that counter",&local_ff8);
        std::operator+(&local_fb8,&local_fd8,
                       " returned only values values between previous and next atomicCounter(counter"
                      );
        de::toString<int>(&local_1018,
                          (int *)&counterIncrements.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_f98,&local_fb8,&local_1018);
        std::operator+(&local_f78,&local_f98,").");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f58,pcVar5,&local_1019);
        tcu::ScopedLogSection::ScopedLogSection(&local_eb0,log,&local_ed0,&local_f58);
        std::__cxx11::string::~string((string *)&local_f58);
        std::allocator<char>::~allocator(&local_1019);
        std::__cxx11::string::~string((string *)&local_f78);
        std::__cxx11::string::~string((string *)&local_f98);
        std::__cxx11::string::~string((string *)&local_1018);
        std::__cxx11::string::~string((string *)&local_fb8);
        std::__cxx11::string::~string((string *)&local_fd8);
        std::__cxx11::string::~string((string *)&local_ff8);
        std::__cxx11::string::~string((string *)&local_ed0);
        std::allocator<char>::~allocator(&local_f31);
        std::__cxx11::string::~string((string *)&local_ef0);
        std::__cxx11::string::~string((string *)&local_f10);
        std::__cxx11::string::~string((string *)&local_f30);
        bVar2 = checkRange(log,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &counterDecrements.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &counterPostGets.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &counterGets.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&uniquenesCheck_2,log,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&uniquenesCheck_2,(char (*) [31])0x2af4e5d);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(int *)&counterIncrements.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(char (*) [79])
                                     ") returned only values between previous and next call to atomicCounter(counter"
                             );
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(int *)&counterIncrements.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2c156ab);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&uniquenesCheck_2);
        }
        else {
          counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          tcu::TestLog::operator<<(&local_11a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<(&local_11a0,(char (*) [31])0x2af4e5d);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(int *)&counterIncrements.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(char (*) [85])
                                     ") returned value that is not between previous and next call to atomicCounter(counter"
                             );
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(int *)&counterIncrements.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2c156ab);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_11a0);
        }
        tcu::ScopedLogSection::~ScopedLogSection(&local_eb0);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &counterGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &counterPostGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &counterPreGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &counterDecrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (bool)(counterIncrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
}

Assistant:

bool AtomicCounterTest::checkAndLogCallValues (TestLog& log, const vector<deUint32>& increments, const vector<deUint32>& decrements, const vector<deUint32>& preGets, const vector<deUint32>& postGets, const vector<deUint32>& gets) const
{
	bool isOk = true;

	for (int counterNdx = 0; counterNdx < m_spec.atomicCounterCount; counterNdx++)
	{
		vector<deUint32> counterIncrements;
		vector<deUint32> counterDecrements;
		vector<deUint32> counterPreGets;
		vector<deUint32> counterPostGets;
		vector<deUint32> counterGets;

		getCountersValues(counterIncrements,	increments,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterDecrements,	decrements,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterPreGets,		preGets,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterPostGets,		postGets,	counterNdx, m_spec.atomicCounterCount);
		getCountersValues(counterGets,			gets,		counterNdx, m_spec.atomicCounterCount);

		if (m_spec.operations == OPERATION_GET)
		{
			tcu::ScopedLogSection valueCheck(log, ("counter" + de::toString(counterNdx) + " value check").c_str(), ("Check that counter" + de::toString(counterNdx) + " values haven't changed.").c_str());
			int changedValues = 0;

			for (int valueNdx = 0; valueNdx < (int)gets.size(); valueNdx++)
			{
				if ((!m_spec.useBranches || gets[valueNdx] != (deUint32)-1) && gets[valueNdx] != getInitialValue())
				{
					if (changedValues < 20)
						log << TestLog::Message << "atomicCounter(counter" << counterNdx << ") returned " << gets[valueNdx] << " expected " << getInitialValue() << TestLog::EndMessage;
					isOk = false;
					changedValues++;
				}
			}

			if (changedValues == 0)
				log << TestLog::Message << "All values returned by atomicCounter(counter" << counterNdx << ") match initial value " << getInitialValue() <<  "." << TestLog::EndMessage;
			else if (changedValues > 20)
				log << TestLog::Message << "Total number of invalid values returned by atomicCounter(counter" << counterNdx << ") " << changedValues << " displaying first 20 values." <<  TestLog::EndMessage;
		}
		else if ((m_spec.operations & (OPERATION_INC|OPERATION_DEC)) == (OPERATION_INC|OPERATION_DEC))
		{
			tcu::ScopedLogSection valueCheck(log, ("counter" + de::toString(counterNdx) + " path check").c_str(), ("Check that there is order in which counter" + de::toString(counterNdx) + " increments and decrements could have happened.").c_str());
			if (!checkPath(counterIncrements, counterDecrements, getInitialValue(), m_spec))
			{
				isOk = false;
				log << TestLog::Message << "No possible order of calls to atomicCounterIncrement(counter" << counterNdx << ") and atomicCounterDecrement(counter" << counterNdx << ") found." << TestLog::EndMessage;
			}
			else
				log << TestLog::Message << "Found possible order of calls to atomicCounterIncrement(counter" << counterNdx << ") and atomicCounterDecrement(counter" << counterNdx << ")." << TestLog::EndMessage;
		}
		else if ((m_spec.operations & OPERATION_INC) != 0)
		{
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check uniqueness and linearity").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only unique and linear values.").c_str());

				if (!checkUniquenessAndLinearity(log, counterIncrements))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned non unique values." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned only unique values." << TestLog::EndMessage;
			}

			if (isOk && ((m_spec.operations & OPERATION_GET) != 0))
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check range").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only values values between previous and next atomicCounter(counter" + de::toString(counterNdx) + ").").c_str());

				if (!checkRange(log, counterIncrements, counterPreGets, counterPostGets))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned value that is not between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterIncrement(counter" << counterNdx << ") returned only values between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
			}
		}
		else if ((m_spec.operations & OPERATION_DEC) != 0)
		{
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check uniqueness and linearity").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only unique and linear values.").c_str());

				if (!checkUniquenessAndLinearity(log, counterDecrements))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned non unique values." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned only unique values." << TestLog::EndMessage;
			}

			if (isOk && ((m_spec.operations & OPERATION_GET) != 0))
			{
				tcu::ScopedLogSection uniquenesCheck(log, ("counter" + de::toString(counterNdx) + " check range").c_str(), ("Check that counter" + de::toString(counterNdx) + " returned only values values between previous and next atomicCounter(counter" + de::toString(counterNdx) + ".").c_str());

				if (!checkRange(log, counterDecrements, counterPostGets, counterPreGets))
				{
					isOk = false;
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned value that is not between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
				}
				else
					log << TestLog::Message << "atomicCounterDecrement(counter" << counterNdx << ") returned only values between previous and next call to atomicCounter(counter" << counterNdx << ")." << TestLog::EndMessage;
			}
		}
	}

	return isOk;
}